

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O3

bool __thiscall
sptk::SymmetricMatrix::GetDiagonal
          (SymmetricMatrix *this,vector<double,_std::allocator<double>_> *diagonal_elements)

{
  pointer ppdVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  
  if (diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0) {
    uVar3 = this->num_dimension_;
    if ((long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)(int)uVar3) {
      std::vector<double,_std::allocator<double>_>::resize(diagonal_elements,(long)(int)uVar3);
      uVar3 = this->num_dimension_;
    }
    if (0 < (int)uVar3) {
      ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 0;
      do {
        pdVar2[uVar4] = ppdVar1[uVar4][uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0;
}

Assistant:

bool SymmetricMatrix::GetDiagonal(
    std::vector<double>* diagonal_elements) const {
  if (NULL == diagonal_elements) {
    return false;
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }
  for (int i(0); i < num_dimension_; ++i) {
    (*diagonal_elements)[i] = index_[i][i];
  }
  return true;
}